

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1523::run(TestCase1523 *this)

{
  SegmentBuilder *pSVar1;
  bool bVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ReaderOptions options;
  Runnable local_490;
  MallocMessageBuilder *local_488;
  SegmentArrayMessageReader *local_480;
  _func_int **local_478;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_470;
  undefined1 local_318 [24];
  int local_300;
  MallocMessageBuilder copy;
  SegmentArrayMessageReader reader;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&local_478,&builder.super_MessageBuilder);
  reader.super_MessageReader._vptr_MessageReader = local_478;
  reader.super_MessageReader.options._8_8_ = aStack_470.value.ownFile.content.disposer;
  AnyPointer::Builder::initAs<capnp::List<capnp::Void,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> *)&copy,(Builder *)&reader,
             0x10000000);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((SegmentBuilder *)AVar3.size_ != (SegmentBuilder *)0x1 && kj::_::Debug::minSeverity < 3) {
    copy.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(copy.super_MessageBuilder._vptr_MessageBuilder._4_4_,1);
    local_478 = (_func_int **)AVar3.size_;
    kj::_::Debug::log<char_const(&)[42],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f8,ERROR,"\"failed: expected \" \"(1) == (segments.size())\", 1, segments.size()"
               ,(char (*) [42])"failed: expected (1) == (segments.size())",(int *)&copy,
               (unsigned_long *)&local_478);
  }
  pSVar1 = (SegmentBuilder *)(AVar3.ptr)->size_;
  if (((SegmentBuilder *)0xf < pSVar1) && (kj::_::Debug::minSeverity < 3)) {
    copy.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(copy.super_MessageBuilder._vptr_MessageBuilder._4_4_,0x10);
    local_478 = (_func_int **)pSVar1;
    kj::_::Debug::log<char_const(&)[45],unsigned_long,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f9,ERROR,
               "\"failed: expected \" \"(segments[0].size()) < (16)\", segments[0].size(), 16",
               (char (*) [45])"failed: expected (segments[0].size()) < (16)",
               (unsigned_long *)&local_478,(int *)&copy);
  }
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,AVar3,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Reader *)&local_478,&reader.super_MessageReader);
  bVar2 = aStack_470._28_2_ != 0;
  local_318._16_8_ = (WirePointer *)0x0;
  if (bVar2) {
    local_318._16_8_ = aStack_470.value.ownFile.content.disposer;
  }
  local_300 = 0x7fffffff;
  if (bVar2) {
    local_300 = aStack_470.value.line;
  }
  local_318[0] = false;
  local_318._1_3_ = 0;
  local_318._4_4_ = 0;
  local_318._8_4_ = 0;
  local_318._12_4_ = 0;
  if (bVar2) {
    local_318._0_4_ = local_478._0_4_;
    local_318._4_4_ = local_478._4_4_;
    local_318._8_4_ = aStack_470._0_4_;
    local_318._12_4_ = aStack_470._4_4_;
  }
  copy.super_MessageBuilder.arenaSpace[0] = local_318;
  copy.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)&PTR_run_00392360;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_478,(Runnable *)&copy);
  bVar2 = local_478._0_1_;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_478);
  if ((bVar2 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[99]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5fd,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr\""
               ,(char (*) [99])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr"
              );
  }
  MallocMessageBuilder::MallocMessageBuilder(&copy,0x400,GROW_HEURISTICALLY);
  local_490._vptr_Runnable = (_func_int **)&PTR_run_00392390;
  local_488 = &copy;
  local_480 = &reader;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_478,&local_490);
  bVar2 = local_478._0_1_;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_478);
  if ((bVar2 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[109]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x600,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr\""
               ,(char (*) [109])
                "failed: expected kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&copy);
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, VoidListAmplification) {
  MallocMessageBuilder builder;
  builder.initRoot<test::TestAnyPointer>().getAnyPointerField().initAs<List<Void>>(1u << 28);

  auto segments = builder.getSegmentsForOutput();
  EXPECT_EQ(1, segments.size());
  EXPECT_LT(segments[0].size(), 16);  // quite small for such a big list!

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>().getAnyPointerField();
  EXPECT_NONFATAL_FAILURE(root.getAs<List<TestAllTypes>>());

  MallocMessageBuilder copy;
  EXPECT_NONFATAL_FAILURE(copy.setRoot(reader.getRoot<AnyPointer>()));
}